

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O3

string * __thiscall
anon_unknown.dwarf_13061b0::Helper::GetDestination
          (string *__return_storage_ptr__,Helper *this,cmInstallCommandArguments *args,
          string *varName,string *guess)

{
  pointer pcVar1;
  string *psVar2;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *extraout_RAX_01;
  size_type *local_48;
  string *local_40;
  size_type local_38;
  undefined8 uStack_30;
  
  if (args != (cmInstallCommandArguments *)0x0) {
    psVar2 = cmInstallCommandArguments::GetDestination_abi_cxx11_(args);
    if (psVar2->_M_string_length != 0) {
      psVar2 = cmInstallCommandArguments::GetDestination_abi_cxx11_(args);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar1 = (psVar2->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar1,pcVar1 + psVar2->_M_string_length);
      return extraout_RAX;
    }
  }
  psVar2 = cmMakefile::GetSafeDefinition(this->Makefile,varName);
  pcVar1 = (psVar2->_M_dataplus)._M_p;
  local_48 = &local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + psVar2->_M_string_length);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_40 == (string *)0x0) {
    pcVar1 = (guess->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + guess->_M_string_length);
    local_40 = extraout_RAX_00;
    if (local_48 != &local_38) {
      operator_delete(local_48,local_38 + 1);
      local_40 = extraout_RAX_01;
    }
  }
  else {
    if (local_48 == &local_38) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = local_38;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_30;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_48;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = local_38;
    }
    __return_storage_ptr__->_M_string_length = (size_type)local_40;
  }
  return local_40;
}

Assistant:

std::string Helper::GetDestination(const cmInstallCommandArguments* args,
                                   const std::string& varName,
                                   const std::string& guess) const
{
  if (args && !args->GetDestination().empty()) {
    return args->GetDestination();
  }
  std::string val = this->Makefile->GetSafeDefinition(varName);
  if (!val.empty()) {
    return val;
  }
  return guess;
}